

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vktApiObjectManagementTests.cpp
# Opt level: O3

TestStatus *
vkt::api::anon_unknown_1::createMultipleUniqueResourcesTest<vkt::api::(anonymous_namespace)::Fence>
          (TestStatus *__return_storage_ptr__,Context *context,Parameters params)

{
  TestStatus *pTVar1;
  DeviceInterface *vk;
  VkDevice device;
  Unique<vk::Handle<(vk::HandleType)6>_> obj0;
  Unique<vk::Handle<(vk::HandleType)6>_> obj2;
  Unique<vk::Handle<(vk::HandleType)6>_> obj3;
  Unique<vk::Handle<(vk::HandleType)6>_> obj1;
  VkFence local_f8;
  Deleter<vk::Handle<(vk::HandleType)6>_> DStack_f0;
  undefined1 local_d8 [16];
  VkDevice local_c8;
  VkAllocationCallbacks *pVStack_c0;
  undefined1 local_b8 [16];
  VkDevice local_a8;
  VkAllocationCallbacks *pVStack_a0;
  TestStatus *local_90;
  Move<vk::Handle<(vk::HandleType)6>_> local_88;
  Move<vk::Handle<(vk::HandleType)6>_> local_68;
  VkFenceCreateInfo local_48;
  
  local_90 = __return_storage_ptr__;
  vk = Context::getDeviceInterface(context);
  device = Context::getDevice(context);
  Context::getUniversalQueueFamilyIndex(context);
  local_d8._0_4_ = 8;
  local_d8._8_8_ = (DeviceInterface *)0x0;
  local_c8 = (VkDevice)CONCAT44(local_c8._4_4_,params.flags);
  ::vk::createFence(&local_88,vk,device,(VkFenceCreateInfo *)local_d8,(VkAllocationCallbacks *)0x0);
  local_f8.m_internal =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  DStack_f0.m_deviceIface =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
  DStack_f0.m_device =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device;
  DStack_f0.m_allocator =
       local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  local_b8._0_4_ = 8;
  local_b8._8_8_ = (DeviceInterface *)0x0;
  local_a8 = (VkDevice)CONCAT44(local_a8._4_4_,params.flags);
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_d8,vk,device,
                    (VkFenceCreateInfo *)local_b8,(VkAllocationCallbacks *)0x0);
  local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal = local_d8._0_8_;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)local_d8._8_8_;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device = local_c8;
  local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator = pVStack_c0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal._0_4_ =
       VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface =
       (DeviceInterface *)0x0;
  local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device._0_4_ =
       params.flags;
  ::vk::createFence((Move<vk::Handle<(vk::HandleType)6>_> *)local_b8,vk,device,
                    (VkFenceCreateInfo *)&local_68,(VkAllocationCallbacks *)0x0);
  local_d8._0_8_ = local_b8._0_8_;
  local_d8._8_8_ = local_b8._8_8_;
  local_c8 = local_a8;
  pVStack_c0 = pVStack_a0;
  local_48.sType = VK_STRUCTURE_TYPE_FENCE_CREATE_INFO;
  local_48.pNext = (void *)0x0;
  local_48.flags = params.flags;
  ::vk::createFence(&local_68,vk,device,&local_48,(VkAllocationCallbacks *)0x0);
  pTVar1 = local_90;
  local_b8._4_4_ =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal._4_4_;
  local_b8._0_4_ =
       (VkStructureType)
       local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal;
  local_a8 = (VkDevice)
             CONCAT44(local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_device
                      ._4_4_,local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.
                             m_device._0_4_);
  local_b8._8_8_ =
       local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_deviceIface;
  pVStack_a0 = local_68.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter.m_allocator;
  if (local_b8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(local_b8 + 8),(VkFence)local_b8._0_8_);
  }
  if (local_d8._0_8_ != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              ((Deleter<vk::Handle<(vk::HandleType)6>_> *)(local_d8 + 8),(VkFence)local_d8._0_8_);
  }
  if (local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()
              (&local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.deleter,
               (VkFence)local_88.super_RefBase<vk::Handle<(vk::HandleType)6>_>.m_data.object.
                        m_internal);
  }
  if (local_f8.m_internal != 0) {
    ::vk::refdetails::Deleter<vk::Handle<(vk::HandleType)6>_>::operator()(&DStack_f0,local_f8);
  }
  local_f8.m_internal = (deUint64)&DStack_f0.m_device;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_f8,"Ok","");
  pTVar1->m_code = QP_TEST_RESULT_PASS;
  (pTVar1->m_description)._M_dataplus._M_p = (pointer)&(pTVar1->m_description).field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&pTVar1->m_description,local_f8.m_internal,
             (undefined1 *)
             ((long)&(DStack_f0.m_deviceIface)->_vptr_DeviceInterface + local_f8.m_internal));
  if ((VkDevice *)local_f8.m_internal != &DStack_f0.m_device) {
    operator_delete((void *)local_f8.m_internal,(ulong)(DStack_f0.m_device + 1));
  }
  return pTVar1;
}

Assistant:

tcu::TestStatus createMultipleUniqueResourcesTest (Context& context, typename Object::Parameters params)
{
	const Environment					env		(context, 1u);
	const typename Object::Resources	res0	(env, params);
	const typename Object::Resources	res1	(env, params);
	const typename Object::Resources	res2	(env, params);
	const typename Object::Resources	res3	(env, params);

	{
		Unique<typename Object::Type>	obj0	(Object::create(env, res0, params));
		Unique<typename Object::Type>	obj1	(Object::create(env, res1, params));
		Unique<typename Object::Type>	obj2	(Object::create(env, res2, params));
		Unique<typename Object::Type>	obj3	(Object::create(env, res3, params));
	}

	return tcu::TestStatus::pass("Ok");
}